

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

WhereTerm * findTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  byte bVar1;
  Parse *pParse;
  long lVar2;
  char cVar3;
  char cVar4;
  uchar *b;
  CollSeq *pCVar5;
  byte *pbVar6;
  Expr *pEVar7;
  byte *pbVar8;
  int iVar9;
  long lVar10;
  WhereClause *pWVar11;
  ulong uVar12;
  ulong uVar13;
  WhereTerm *pWVar14;
  WhereTerm *pWVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  int aEquiv [22];
  int local_88 [22];
  
  local_88[0] = iCur;
  local_88[1] = iColumn;
  iVar17 = 2;
  lVar10 = 2;
  pWVar14 = (WhereTerm *)0x0;
  pWVar11 = pWC;
  iVar16 = iColumn;
  do {
    while (pWVar11 == (WhereClause *)0x0) {
      if (iVar17 <= lVar10) {
        return pWVar14;
      }
      iCur = local_88[lVar10];
      iVar16 = local_88[lVar10 + 1];
      lVar10 = lVar10 + 2;
      pWVar11 = pWC;
    }
    iVar9 = pWVar11->nTerm;
    if (iVar9 != 0) {
      pWVar15 = pWVar11->a;
      do {
        if ((pWVar15->leftCursor == iCur) && ((pWVar15->u).leftColumn == iVar16)) {
          if (((pWVar15->prereqRight & notReady) == 0) &&
             ((op & 0xfff & (uint)pWVar15->eOperator) != 0)) {
            if (-1 < (char)pWVar15->eOperator && (pIdx != (Index *)0x0 && -1 < iColumn)) {
              pEVar7 = pWVar15->pExpr;
              pParse = pWVar11->pParse;
              cVar4 = pIdx->pTable->aCol[(uint)iColumn].affinity;
              cVar3 = comparisonAffinity(pEVar7);
              if (cVar3 == 'b') {
LAB_0016b8bf:
                pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pEVar7->pLeft,pEVar7->pRight);
                if (pCVar5 == (CollSeq *)0x0) {
                  pCVar5 = pParse->db->pDfltColl;
                }
                if (*pIdx->aiColumn == iColumn) {
                  uVar12 = 0;
                }
                else {
                  uVar13 = 0;
                  do {
                    if (pIdx->nColumn == uVar13) {
                      cVar4 = '\x01';
                      goto LAB_0016b96f;
                    }
                    uVar12 = uVar13 + 1;
                    lVar2 = uVar13 + 1;
                    uVar13 = uVar12;
                  } while (pIdx->aiColumn[lVar2] != iColumn);
                }
                pbVar8 = (byte *)pCVar5->zName;
                pbVar6 = (byte *)pIdx->azColl[uVar12];
                bVar1 = *pbVar8;
                while ((bVar1 != 0 && (pbVar8 = pbVar8 + 1, ""[bVar1] == ""[*pbVar6]))) {
                  pbVar6 = pbVar6 + 1;
                  bVar1 = *pbVar8;
                }
                cVar4 = (""[bVar1] != ""[*pbVar6]) * '\t';
              }
              else {
                if (cVar3 == 'a') {
                  bVar18 = cVar4 == 'a';
                }
                else {
                  bVar18 = 'b' < cVar4;
                }
                cVar4 = '\t';
                if (bVar18) goto LAB_0016b8bf;
              }
LAB_0016b96f:
              if (cVar4 == '\t') goto LAB_0016ba2b;
              if (cVar4 != '\0') {
                return (WhereTerm *)0x0;
              }
            }
            if ((pWVar15->prereqRight == 0) && ((pWVar15->eOperator & 2) != 0)) {
              return pWVar15;
            }
            if (pWVar14 == (WhereTerm *)0x0) {
              pWVar14 = pWVar15;
            }
          }
          if ((iVar17 < 0x16 & *(byte *)((long)&pWVar15->eOperator + 1) >> 2) == 1) {
            for (pEVar7 = pWVar15->pExpr->pRight;
                (pEVar7 != (Expr *)0x0 && ((pEVar7->op == '\\' || (pEVar7->op == '\x18'))));
                pEVar7 = pEVar7->pLeft) {
            }
            if (iVar17 < 1) {
              uVar13 = 0;
            }
            else {
              uVar13 = 0;
              do {
                if ((local_88[uVar13] == pEVar7->iTable) &&
                   (local_88[uVar13 + 1] == (int)pEVar7->iColumn)) break;
                uVar13 = uVar13 + 2;
              } while ((int)uVar13 < iVar17);
            }
            if ((int)uVar13 == iVar17) {
              local_88[uVar13 & 0xffffffff] = pEVar7->iTable;
              local_88[(uVar13 & 0xffffffff) + 1] = (int)pEVar7->iColumn;
              iVar17 = iVar17 + 2;
            }
          }
        }
LAB_0016ba2b:
        pWVar15 = pWVar15 + 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    pWVar11 = pWVar11->pOuter;
  } while( true );
}

Assistant:

static WhereTerm *findTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pTerm;            /* Term being examined as possible result */
  WhereTerm *pResult = 0;      /* The answer to return */
  WhereClause *pWCOrig = pWC;  /* Original pWC value */
  int j, k;                    /* Loop counters */
  Expr *pX;                /* Pointer to an expression */
  Parse *pParse;           /* Parsing context */
  int iOrigCol = iColumn;  /* Original value of iColumn */
  int nEquiv = 2;          /* Number of entires in aEquiv[] */
  int iEquiv = 2;          /* Number of entries of aEquiv[] processed so far */
  int aEquiv[22];          /* iCur,iColumn and up to 10 other equivalents */

  assert( iCur>=0 );
  aEquiv[0] = iCur;
  aEquiv[1] = iColumn;
  for(;;){
    for(pWC=pWCOrig; pWC; pWC=pWC->pOuter){
      for(pTerm=pWC->a, k=pWC->nTerm; k; k--, pTerm++){
        if( pTerm->leftCursor==iCur
          && pTerm->u.leftColumn==iColumn
        ){
          if( (pTerm->prereqRight & notReady)==0
           && (pTerm->eOperator & op & WO_ALL)!=0
          ){
            if( iOrigCol>=0 && pIdx && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              char idxaff;
      
              pX = pTerm->pExpr;
              pParse = pWC->pParse;
              idxaff = pIdx->pTable->aCol[iOrigCol].affinity;
              if( !sqlite3IndexAffinityOk(pX, idxaff) ){
                continue;
              }
      
              /* Figure out the collation sequence required from an index for
              ** it to be useful for optimising expression pX. Store this
              ** value in variable pColl.
              */
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
      
              for(j=0; pIdx->aiColumn[j]!=iOrigCol; j++){
                if( NEVER(j>=pIdx->nColumn) ) return 0;
              }
              if( sqlite3StrICmp(pColl->zName, pIdx->azColl[j]) ){
                continue;
              }
            }
            if( pTerm->prereqRight==0 && (pTerm->eOperator&WO_EQ)!=0 ){
              pResult = pTerm;
              goto findTerm_success;
            }else if( pResult==0 ){
              pResult = pTerm;
            }
          }
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && nEquiv<ArraySize(aEquiv)
          ){
            pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight);
            assert( pX->op==TK_COLUMN );
            for(j=0; j<nEquiv; j+=2){
              if( aEquiv[j]==pX->iTable && aEquiv[j+1]==pX->iColumn ) break;
            }
            if( j==nEquiv ){
              aEquiv[j] = pX->iTable;
              aEquiv[j+1] = pX->iColumn;
              nEquiv += 2;
            }
          }
        }
      }
    }
    if( iEquiv>=nEquiv ) break;
    iCur = aEquiv[iEquiv++];
    iColumn = aEquiv[iEquiv++];
  }
findTerm_success:
  return pResult;
}